

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brake.cpp
# Opt level: O1

void __thiscall
ruckig::BrakeProfile::velocity_brake
          (BrakeProfile *this,double v0,double a0,double vMax,double vMin,double param_5,double aMin
          ,double jMax)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  (this->j)._M_elems[0] = -jMax;
  dVar2 = (v0 - vMax) * (jMax + jMax) + a0 * a0;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar4 = (a0 - aMin) / jMax;
  dVar3 = dVar2 / ABS(jMax) + a0 / jMax;
  dVar2 = (v0 - vMin) * jMax + a0 * a0 * 0.5;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar2 = a0 / jMax + dVar2 / ABS(jMax);
  if (dVar3 <= dVar2) {
    dVar2 = dVar3;
  }
  if (dVar2 <= dVar4) {
    dVar2 = dVar2 + -2.2e-14;
    lVar1 = 8;
  }
  else {
    dVar2 = (-jMax * dVar4 * 0.5 + a0) * dVar4 + v0;
    dVar3 = -(dVar2 - vMax) / aMin;
    dVar2 = aMin / (jMax + jMax) - (dVar2 - vMin) / aMin;
    if (dVar3 <= dVar2) {
      dVar2 = dVar3;
    }
    dVar3 = 0.0;
    if (0.0 <= dVar4 + -2.2e-14) {
      dVar3 = dVar4 + -2.2e-14;
    }
    (this->t)._M_elems[0] = dVar3;
    lVar1 = 0x10;
  }
  dVar3 = 0.0;
  if (0.0 <= dVar2) {
    dVar3 = dVar2;
  }
  *(double *)((long)(this->t)._M_elems + lVar1 + -8) = dVar3;
  return;
}

Assistant:

void BrakeProfile::velocity_brake(double v0, double a0, double vMax, double vMin, double, double aMin, double jMax) {
    j[0] = -jMax;
    const double t_to_a_min = (a0 - aMin)/jMax;
    const double t_to_v_max = a0/jMax + std::sqrt(a0*a0 + 2 * jMax * (v0 - vMax)) / std::abs(jMax);
    const double t_to_v_min = a0/jMax + std::sqrt(a0*a0 / 2 + jMax * (v0 - vMin)) / std::abs(jMax);
    const double t_min_to_v_max = std::min(t_to_v_max, t_to_v_min);

    if (t_to_a_min < t_min_to_v_max) {
        const double v_at_a_min = v_at_t(v0, a0, -jMax, t_to_a_min);
        const double t_to_v_max_with_constant = -(v_at_a_min - vMax)/aMin;
        const double t_to_v_min_with_constant = aMin/(2*jMax) - (v_at_a_min - vMin)/aMin;

        t[0] = std::max(t_to_a_min - eps, 0.0);
        t[1] = std::max(std::min(t_to_v_max_with_constant, t_to_v_min_with_constant), 0.0);

    } else {
        t[0] = std::max(t_min_to_v_max - eps, 0.0);
    }
}